

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall sysapi::epoll::epoll(epoll *this)

{
  int new_fd;
  int *piVar1;
  
  file_descriptor::file_descriptor(&this->fd_);
  timer::timer(&this->timer_);
  new_fd = epoll_create1(0x80000);
  if (new_fd == -1) {
    piVar1 = __errno_location();
    throw_error(*piVar1,"epoll_create1()");
  }
  if (-1 < new_fd) {
    file_descriptor::reset(&this->fd_,new_fd);
    return;
  }
  __assert_fail("r >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/epoll.cpp",
                0x15,"sysapi::epoll::epoll()");
}

Assistant:

epoll::epoll()
{
    int r = ::epoll_create1(EPOLL_CLOEXEC);
    if (r == -1)
        throw_error(errno, "epoll_create1()");

    assert(r >= 0);

    fd_.reset(r);
}